

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
::nosize_unchecked_emplace_at<slang::SVInt&>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,SVInt *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  ulong uVar3;
  uint uVar4;
  ushort uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  SVInt *this_00;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  pgVar2 = arrays_->groups_;
  lVar7 = pos0 * 0x10;
  pgVar1 = pgVar2 + pos0;
  auVar9[0] = -(pgVar1->m[0].n == '\0');
  auVar9[1] = -(pgVar1->m[1].n == '\0');
  auVar9[2] = -(pgVar1->m[2].n == '\0');
  auVar9[3] = -(pgVar1->m[3].n == '\0');
  auVar9[4] = -(pgVar1->m[4].n == '\0');
  auVar9[5] = -(pgVar1->m[5].n == '\0');
  auVar9[6] = -(pgVar1->m[6].n == '\0');
  auVar9[7] = -(pgVar1->m[7].n == '\0');
  auVar9[8] = -(pgVar1->m[8].n == '\0');
  auVar9[9] = -(pgVar1->m[9].n == '\0');
  auVar9[10] = -(pgVar1->m[10].n == '\0');
  auVar9[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar9[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar9[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar9[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar9[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar6 = (uint)(ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe);
  if (uVar6 == 0) {
    uVar3 = arrays_->groups_size_mask;
    lVar8 = 1;
    do {
      pgVar2[pos0].m[0xf].n = pgVar2[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar8 & uVar3;
      lVar7 = pos0 * 0x10;
      pgVar1 = pgVar2 + pos0;
      auVar10[0] = -(pgVar1->m[0].n == '\0');
      auVar10[1] = -(pgVar1->m[1].n == '\0');
      auVar10[2] = -(pgVar1->m[2].n == '\0');
      auVar10[3] = -(pgVar1->m[3].n == '\0');
      auVar10[4] = -(pgVar1->m[4].n == '\0');
      auVar10[5] = -(pgVar1->m[5].n == '\0');
      auVar10[6] = -(pgVar1->m[6].n == '\0');
      auVar10[7] = -(pgVar1->m[7].n == '\0');
      auVar10[8] = -(pgVar1->m[8].n == '\0');
      auVar10[9] = -(pgVar1->m[9].n == '\0');
      auVar10[10] = -(pgVar1->m[10].n == '\0');
      auVar10[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar10[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar10[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar10[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar10[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar5 = (ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe;
      uVar6 = (uint)uVar5;
      lVar8 = lVar8 + 1;
    } while (uVar5 == 0);
  }
  uVar4 = 0;
  if (uVar6 != 0) {
    for (; (uVar6 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
    }
  }
  this_00 = (SVInt *)((long)&arrays_->elements_[pos0 * 0xf].super_SVIntStorage.field_0 +
                     (ulong)(uVar4 << 4));
  slang::SVInt::SVInt(this_00,&args->super_SVIntStorage);
  (pgVar2->m + lVar7)[uVar4].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar2->m + lVar7);
  __return_storage_ptr__->n = uVar4;
  __return_storage_ptr__->p = this_00;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }